

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_rescale_enc.c
# Opt level: O3

int WebPPictureRescale(WebPPicture *picture,int width,int height)

{
  int iVar1;
  int iVar2;
  rescaler_t *work;
  int iVar3;
  int width_local;
  int height_local;
  WebPPicture tmp;
  
  if (picture == (WebPPicture *)0x0) {
    return 0;
  }
  iVar2 = picture->width;
  iVar3 = picture->height;
  width_local = width;
  height_local = height;
  iVar1 = WebPRescalerGetScaledDimensions(iVar2,iVar3,&width_local,&height_local);
  if (iVar1 == 0) goto LAB_0012ca19;
  memcpy(&tmp,picture,0x100);
  WebPPictureResetBuffers(&tmp);
  tmp.width = width_local;
  tmp.height = height_local;
  iVar1 = WebPPictureAlloc(&tmp);
  if (iVar1 == 0) goto LAB_0012ca35;
  if (picture->use_argb == 0) {
    work = (rescaler_t *)WebPSafeMalloc((long)width_local * 2,4);
    if (work == (rescaler_t *)0x0) goto LAB_0012ca23;
    if (picture->a != (uint8_t *)0x0) {
      WebPInitAlphaProcessing();
      iVar1 = RescalePlane(picture->a,iVar2,iVar3,picture->a_stride,tmp.a,width_local,height_local,
                           tmp.a_stride,work,1);
      if (iVar1 == 0) goto LAB_0012ca19;
    }
    AlphaMultiplyY(picture,0);
    iVar1 = RescalePlane(picture->y,iVar2,iVar3,picture->y_stride,tmp.y,width_local,height_local,
                         tmp.y_stride,work,1);
    if (iVar1 != 0) {
      iVar1 = iVar2 + 1 >> 1;
      iVar3 = iVar3 + 1 >> 1;
      iVar2 = RescalePlane(picture->u,iVar1,iVar3,picture->uv_stride,tmp.u,width_local + 1 >> 1,
                           height_local + 1 >> 1,tmp.uv_stride,work,1);
      if ((iVar2 != 0) &&
         (iVar2 = RescalePlane(picture->v,iVar1,iVar3,picture->uv_stride,tmp.v,width_local + 1 >> 1,
                               height_local + 1 >> 1,tmp.uv_stride,work,1), iVar2 != 0)) {
        if (tmp.a != (uint8_t *)0x0) {
          WebPMultRows(tmp.y,tmp.y_stride,tmp.a,tmp.a_stride,tmp.width,tmp.height,1);
        }
LAB_0012c881:
        WebPPictureFree(picture);
        WebPSafeFree(work);
        memcpy(picture,&tmp,0x100);
        return 1;
      }
    }
  }
  else {
    work = (rescaler_t *)WebPSafeMalloc((long)width_local << 3,4);
    if (work == (rescaler_t *)0x0) {
LAB_0012ca23:
      WebPPictureFree(&tmp);
      tmp.error_code = VP8_ENC_ERROR_OUT_OF_MEMORY;
      goto LAB_0012ca35;
    }
    WebPInitAlphaProcessing();
    WebPMultARGBRows((uint8_t *)picture->argb,picture->argb_stride << 2,picture->width,
                     picture->height,0);
    iVar2 = RescalePlane((uint8_t *)picture->argb,iVar2,iVar3,picture->argb_stride << 2,
                         (uint8_t *)tmp.argb,width_local,height_local,tmp.argb_stride << 2,work,4);
    if (iVar2 != 0) {
      WebPMultARGBRows((uint8_t *)tmp.argb,tmp.argb_stride << 2,tmp.width,tmp.height,1);
      goto LAB_0012c881;
    }
  }
LAB_0012ca19:
  tmp.error_code = VP8_ENC_ERROR_BAD_DIMENSION;
LAB_0012ca35:
  iVar2 = WebPEncodingSetError(picture,tmp.error_code);
  return iVar2;
}

Assistant:

int WebPPictureRescale(WebPPicture* picture, int width, int height) {
  WebPPicture tmp;
  int prev_width, prev_height;
  rescaler_t* work;

  if (picture == NULL) return 0;
  prev_width = picture->width;
  prev_height = picture->height;
  if (!WebPRescalerGetScaledDimensions(
          prev_width, prev_height, &width, &height)) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
  }

  PictureGrabSpecs(picture, &tmp);
  tmp.width = width;
  tmp.height = height;
  if (!WebPPictureAlloc(&tmp)) {
    return WebPEncodingSetError(picture, tmp.error_code);
  }

  if (!picture->use_argb) {
    work = (rescaler_t*)WebPSafeMalloc(2ULL * width, sizeof(*work));
    if (work == NULL) {
      WebPPictureFree(&tmp);
      return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
    // If present, we need to rescale alpha first (for AlphaMultiplyY).
    if (picture->a != NULL) {
      WebPInitAlphaProcessing();
      if (!RescalePlane(picture->a, prev_width, prev_height, picture->a_stride,
                        tmp.a, width, height, tmp.a_stride, work, 1)) {
        return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
      }
    }

    // We take transparency into account on the luma plane only. That's not
    // totally exact blending, but still is a good approximation.
    AlphaMultiplyY(picture, 0);
    if (!RescalePlane(picture->y, prev_width, prev_height, picture->y_stride,
                      tmp.y, width, height, tmp.y_stride, work, 1) ||
        !RescalePlane(picture->u, HALVE(prev_width), HALVE(prev_height),
                      picture->uv_stride, tmp.u, HALVE(width), HALVE(height),
                      tmp.uv_stride, work, 1) ||
        !RescalePlane(picture->v, HALVE(prev_width), HALVE(prev_height),
                      picture->uv_stride, tmp.v, HALVE(width), HALVE(height),
                      tmp.uv_stride, work, 1)) {
      return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
    }
    AlphaMultiplyY(&tmp, 1);
  } else {
    work = (rescaler_t*)WebPSafeMalloc(2ULL * width * 4, sizeof(*work));
    if (work == NULL) {
      WebPPictureFree(&tmp);
      return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
    // In order to correctly interpolate colors, we need to apply the alpha
    // weighting first (black-matting), scale the RGB values, and remove
    // the premultiplication afterward (while preserving the alpha channel).
    WebPInitAlphaProcessing();
    AlphaMultiplyARGB(picture, 0);
    if (!RescalePlane((const uint8_t*)picture->argb, prev_width, prev_height,
                      picture->argb_stride * 4, (uint8_t*)tmp.argb, width,
                      height, tmp.argb_stride * 4, work, 4)) {
      return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
    }
    AlphaMultiplyARGB(&tmp, 1);
  }
  WebPPictureFree(picture);
  WebPSafeFree(work);
  *picture = tmp;
  return 1;
}